

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_prune.cpp
# Opt level: O0

bool __thiscall PruneReplayer::filter_object(PruneReplayer *this,ResourceTag tag,Hash hash)

{
  bool bVar1;
  byte bVar2;
  size_type sVar3;
  bool local_3a;
  bool local_39;
  Hash HStack_28;
  bool hash_filtering;
  Hash hash_local;
  PruneReplayer *pPStack_18;
  ResourceTag tag_local;
  PruneReplayer *this_local;
  
  HStack_28 = hash;
  hash_local._4_4_ = tag;
  pPStack_18 = this;
  bVar1 = filter_timestamp(this,tag,hash,(uint64_t *)0x0);
  if (!bVar1) {
    return false;
  }
  bVar1 = std::
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          ::empty(&this->filter_compute);
  local_39 = false;
  if (bVar1) {
    bVar1 = std::
            unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
            ::empty(&this->filter_graphics);
    local_39 = false;
    if (bVar1) {
      local_39 = std::
                 unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                 ::empty(&this->filter_raytracing);
    }
  }
  bVar2 = (local_39 ^ 0xffU) & 1;
  if (hash_local._4_4_ == RESOURCE_COMPUTE_PIPELINE) {
    sVar3 = std::
            unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
            ::count(&this->banned_compute,&stack0xffffffffffffffd8);
    if (sVar3 != 0) {
      return false;
    }
    if ((bVar2 != 0) &&
       (sVar3 = std::
                unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                ::count(&this->filter_compute,&stack0xffffffffffffffd8), sVar3 == 0)) {
      return false;
    }
  }
  else if (hash_local._4_4_ == RESOURCE_GRAPHICS_PIPELINE) {
    sVar3 = std::
            unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
            ::count(&this->banned_graphics,&stack0xffffffffffffffd8);
    if (sVar3 != 0) {
      return false;
    }
    if ((bVar2 != 0) &&
       (sVar3 = std::
                unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                ::count(&this->filter_graphics,&stack0xffffffffffffffd8), sVar3 == 0)) {
      return false;
    }
  }
  else if (hash_local._4_4_ == RESOURCE_RAYTRACING_PIPELINE) {
    sVar3 = std::
            unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
            ::count(&this->banned_raytracing,&stack0xffffffffffffffd8);
    if (sVar3 != 0) {
      return false;
    }
    if ((bVar2 != 0) &&
       (sVar3 = std::
                unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                ::count(&this->filter_raytracing,&stack0xffffffffffffffd8), sVar3 == 0)) {
      return false;
    }
  }
  local_3a = true;
  if (((this->blob_belongs_to_application_info & 1U) == 0) &&
     (local_3a = true, (this->should_filter_application_hash & 1U) != 0)) {
    sVar3 = std::
            unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
            ::count(this->filtered_blob_hashes + hash_local._4_4_,&stack0xffffffffffffffd8);
    local_3a = sVar3 != 0;
  }
  return local_3a;
}

Assistant:

bool filter_object(ResourceTag tag, Hash hash) const
	{
		if (!filter_timestamp(tag, hash, nullptr))
			return false;

		bool hash_filtering = !(filter_compute.empty() && filter_graphics.empty() && filter_raytracing.empty());
		if (tag == RESOURCE_COMPUTE_PIPELINE)
		{
			if (banned_compute.count(hash))
				return false;
			if (hash_filtering && !filter_compute.count(hash))
				return false;
		}
		else if (tag == RESOURCE_GRAPHICS_PIPELINE)
		{
			if (banned_graphics.count(hash))
				return false;
			if (hash_filtering && !filter_graphics.count(hash))
				return false;
		}
		else if (tag == RESOURCE_RAYTRACING_PIPELINE)
		{
			if (banned_raytracing.count(hash))
				return false;
			if (hash_filtering && !filter_raytracing.count(hash))
				return false;
		}

		return blob_belongs_to_application_info || !should_filter_application_hash || (filtered_blob_hashes[tag].count(hash) != 0);
	}